

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ScissorBoxTestCase::test(ScissorBoxTestCase *this)

{
  StateVerifier *pSVar1;
  TestContext *pTVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  RenderTarget *pRVar5;
  uint uVar6;
  uint y;
  int iVar7;
  bool bVar8;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,0xabcdef);
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar5 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar6 = pRVar5->m_width;
  pRVar5 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  (*pSVar1->_vptr_StateVerifier[3])(pSVar1,pTVar2,0xc10,0,0,(ulong)uVar6,pRVar5->m_height);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar7 = 0x78;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    uVar6 = dVar3 % 0x1f401 - 64000;
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    y = dVar3 % 0x1f401 - 64000;
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    glu::CallLogWrapper::glScissor
              (&(this->super_ApiCase).super_CallLogWrapper,uVar6,y,(GLsizei)((ulong)dVar3 % 0xfa01),
               dVar4 % 0xfa01);
    (*this->m_verifier->_vptr_StateVerifier[3])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xc10,
               (ulong)uVar6,(ulong)y,(ulong)dVar3 % 0xfa01,dVar4 % 0xfa01);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		// verify initial value
		m_verifier->verifyInteger4(m_testCtx, GL_SCISSOR_BOX, 0, 0, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			GLint left		= rnd.getInt(-64000, 64000);
			GLint bottom	= rnd.getInt(-64000, 64000);
			GLsizei width	= rnd.getInt(0, 64000);
			GLsizei height	= rnd.getInt(0, 64000);

			glScissor(left, bottom, width, height);
			m_verifier->verifyInteger4(m_testCtx, GL_SCISSOR_BOX, left, bottom, width, height);
			expectError(GL_NO_ERROR);
		}
	}